

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O2

CordzInfo * __thiscall
absl::lts_20250127::cord_internal::CordzInfo::Next(CordzInfo *this,CordzSnapshot *snapshot)

{
  CordzInfo *handle;
  bool bVar1;
  
  if (snapshot[8] == (CordzSnapshot)0x0) {
    __assert_fail("false && \"snapshot.is_snapshot()\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                  ,0xf3,
                  "auto absl::cord_internal::CordzInfo::Next(const CordzSnapshot &)::(anonymous class)::operator()() const"
                 );
  }
  handle = (this->ci_next_)._M_b._M_p;
  bVar1 = CordzHandle::DiagnosticsHandleIsSafeToInspect
                    ((CordzHandle *)snapshot,&this->super_CordzHandle);
  if (bVar1) {
    bVar1 = CordzHandle::DiagnosticsHandleIsSafeToInspect
                      ((CordzHandle *)snapshot,&handle->super_CordzHandle);
    if (bVar1) {
      return handle;
    }
    __assert_fail("false && \"snapshot.DiagnosticsHandleIsSafeToInspect(next)\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                  ,0xf8,
                  "auto absl::cord_internal::CordzInfo::Next(const CordzSnapshot &)::(anonymous class)::operator()() const"
                 );
  }
  __assert_fail("false && \"snapshot.DiagnosticsHandleIsSafeToInspect(this)\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                ,0xf7,
                "auto absl::cord_internal::CordzInfo::Next(const CordzSnapshot &)::(anonymous class)::operator()() const"
               );
}

Assistant:

CordzInfo* CordzInfo::Next(const CordzSnapshot& snapshot) const {
  ABSL_ASSERT(snapshot.is_snapshot());

  // Similar to the 'Head()' function, we do not need a mutex here.
  CordzInfo* next = ci_next_.load(std::memory_order_acquire);
  ABSL_ASSERT(snapshot.DiagnosticsHandleIsSafeToInspect(this));
  ABSL_ASSERT(snapshot.DiagnosticsHandleIsSafeToInspect(next));
  return next;
}